

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txt.cpp
# Opt level: O0

void __thiscall grib2dec_demo::Txt::setComponent(Txt *this,G2DEC_Message *message)

{
  ostream *poVar1;
  void *this_00;
  int local_2c;
  int local_28;
  int i;
  int j;
  int n;
  G2DEC_Grid *grid;
  G2DEC_Message *message_local;
  Txt *this_local;
  
  poVar1 = std::operator<<((this->super_Output).out,"Parameter id: ");
  this_00 = (void *)std::ostream::operator<<(poVar1,message->parameter);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((this->super_Output).out,"Latitude: [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(message->grid).lat1);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(message->grid).lat2);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(message->grid).latInc);
  poVar1 = std::operator<<(poVar1,"]");
  poVar1 = std::operator<<(poVar1,", Longitude: [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(message->grid).lon1);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(message->grid).lon2);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(message->grid).lonInc);
  poVar1 = std::operator<<(poVar1,"]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  i = 0;
  for (local_28 = 0; local_28 < (message->grid).nj; local_28 = local_28 + 1) {
    for (local_2c = 0; local_2c < (message->grid).ni; local_2c = local_2c + 1) {
      poVar1 = (ostream *)std::ostream::operator<<((this->super_Output).out,message->values[i]);
      std::operator<<(poVar1," ");
      i = i + 1;
    }
    std::ostream::operator<<((this->super_Output).out,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Txt::setComponent(const G2DEC_Message& message)
{
    const G2DEC_Grid& grid = message.grid;

    out << "Parameter id: " << message.parameter << endl;
    out << "Latitude: [" << grid.lat1 << ", " << grid.lat2 << ", " << grid.latInc << "]"
        << ", Longitude: [" << grid.lon1 << ", " << grid.lon2 << ", " << grid.lonInc << "]"
        << endl;

    int n = 0;
    for (int j = 0; j < grid.nj; j++) {
        for (int i = 0; i < grid.ni; i++)
            out << message.values[n++] << " ";
        out << endl;
    }
}